

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void * tt::detail::startThread(void *obj)

{
  ThreadData::runInThread((ThreadData *)obj);
  if (*(void **)((long)obj + 0x20) != (void *)((long)obj + 0x30)) {
    operator_delete(*(void **)((long)obj + 0x20));
  }
  if (*(code **)((long)obj + 0x10) != (code *)0x0) {
    (**(code **)((long)obj + 0x10))(obj,obj,3);
  }
  operator_delete(obj);
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj){
		ThreadData* data = static_cast<ThreadData*>(obj);

		data->runInThread();

		delete data;

		return NULL;
	}